

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

err_t bignParamsDec(bign_params *params,octet *der,size_t count)

{
  bool_t bVar1;
  size_t sVar2;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t len;
  size_t in_stack_000000c8;
  octet *in_stack_000000d0;
  bign_params *in_stack_000000d8;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if ((bVar1 == 0) || (bVar1 = memIsValid(in_RSI,in_RDX), bVar1 == 0)) {
    return 0x6d;
  }
  sVar2 = bignParamsDec_internal(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  if ((sVar2 != 0xffffffffffffffff) && (sVar2 == in_RDX)) {
    return 0;
  }
  return 0x132;
}

Assistant:

err_t bignParamsDec(bign_params* params, const octet der[], size_t count)
{
	size_t len;
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(der, count))
		return ERR_BAD_INPUT;
	len = bignParamsDec_internal(params, der, count);
	if (len == SIZE_MAX || len != count)
		return ERR_BAD_FORMAT;
	return ERR_OK;
}